

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O2

float stb_perlin_noise3_internal
                (float x,float y,float z,int x_wrap,int y_wrap,int z_wrap,uchar seed)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  long lVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  
  uVar11 = x_wrap - 1U & 0xff;
  uVar8 = y_wrap - 1U & 0xff;
  uVar6 = z_wrap - 1U & 0xff;
  iVar21 = -(uint)(y < (float)(int)y);
  iVar22 = -(uint)(x < (float)(int)x);
  auVar1._4_4_ = iVar21;
  auVar1._0_4_ = iVar21;
  auVar1._8_4_ = iVar22;
  auVar1._12_4_ = iVar22;
  uVar2 = movmskpd(0xff,auVar1);
  uVar15 = (int)x - (uVar2 >> 1 & 0x7f);
  uVar18 = (int)y - (uVar2 & 1);
  uVar2 = (int)z - (uint)(z < (float)(int)z);
  uVar19 = (ulong)(uVar18 & uVar8);
  uVar12 = (ulong)(uVar18 + 1 & uVar8);
  uVar9 = (ulong)(uVar2 & uVar6);
  uVar3 = (ulong)(uVar2 + 1 & uVar6);
  fVar23 = x - (float)(int)uVar15;
  fVar24 = y - (float)(int)uVar18;
  fVar27 = ((fVar24 * 6.0 + -15.0) * fVar24 + 10.0) * fVar24 * fVar24 * fVar24;
  fVar26 = z - (float)(int)uVar2;
  fVar28 = ((fVar26 * 6.0 + -15.0) * fVar26 + 10.0) * fVar26 * fVar26 * fVar26;
  uVar5 = CONCAT71(in_register_00000009,seed) & 0xffffffff;
  lVar16 = (ulong)"\a\t\x05"
                  [uVar9 + stb__perlin_randtab
                           [uVar19 + stb__perlin_randtab[(uVar15 & uVar11) + uVar5]]] * 0x10;
  fVar29 = fVar26 + -1.0;
  lVar14 = (ulong)"\a\t\x05"
                  [stb__perlin_randtab[uVar19 + stb__perlin_randtab[(uVar15 & uVar11) + uVar5]] +
                   uVar3] * 0x10;
  fVar31 = fVar24 + -1.0;
  lVar13 = (ulong)"\a\t\x05"
                  [uVar9 + stb__perlin_randtab
                           [stb__perlin_randtab[(uVar15 & uVar11) + uVar5] + uVar12]] * 0x10;
  lVar7 = (ulong)"\a\t\x05"
                 [stb__perlin_randtab[stb__perlin_randtab[(uVar15 & uVar11) + uVar5] + uVar12] +
                  uVar3] * 0x10;
  fVar30 = fVar23 + -1.0;
  lVar20 = (ulong)"\a\t\x05"
                  [uVar9 + stb__perlin_randtab
                           [uVar19 + stb__perlin_randtab[(uVar15 + 1 & uVar11) + uVar5]]] * 0x10;
  lVar17 = (ulong)"\a\t\x05"
                  [stb__perlin_randtab[uVar19 + stb__perlin_randtab[(uVar15 + 1 & uVar11) + uVar5]]
                   + uVar3] * 0x10;
  lVar10 = (ulong)"\a\t\x05"
                  [uVar9 + stb__perlin_randtab
                           [uVar12 + stb__perlin_randtab[(uVar15 + 1 & uVar11) + uVar5]]] * 0x10;
  lVar4 = (ulong)"\a\t\x05"
                 [uVar3 + stb__perlin_randtab
                          [uVar12 + stb__perlin_randtab[(uVar15 + 1 & uVar11) + uVar5]]] * 0x10;
  fVar32 = *(float *)(stb__perlin_grad_basis + lVar20 + 8) * fVar26 +
           *(float *)(stb__perlin_grad_basis + lVar20) * fVar30 +
           *(float *)(stb__perlin_grad_basis + lVar20 + 4) * fVar24;
  fVar33 = *(float *)(stb__perlin_grad_basis + lVar16 + 8) * fVar26 +
           *(float *)(stb__perlin_grad_basis + lVar16) * fVar23 +
           *(float *)(stb__perlin_grad_basis + lVar16 + 4) * fVar24;
  fVar25 = *(float *)(stb__perlin_grad_basis + lVar10 + 8) * fVar26 +
           *(float *)(stb__perlin_grad_basis + lVar10) * fVar30 +
           *(float *)(stb__perlin_grad_basis + lVar10 + 4) * fVar31;
  fVar26 = *(float *)(stb__perlin_grad_basis + lVar13 + 8) * fVar26 +
           *(float *)(stb__perlin_grad_basis + lVar13) * fVar23 +
           *(float *)(stb__perlin_grad_basis + lVar13 + 4) * fVar31;
  fVar32 = ((*(float *)(stb__perlin_grad_basis + lVar17 + 8) * fVar29 +
            *(float *)(stb__perlin_grad_basis + lVar17) * fVar30 +
            *(float *)(stb__perlin_grad_basis + lVar17 + 4) * fVar24) - fVar32) * fVar28 + fVar32;
  fVar33 = ((*(float *)(stb__perlin_grad_basis + lVar14 + 8) * fVar29 +
            *(float *)(stb__perlin_grad_basis + lVar14) * fVar23 +
            *(float *)(stb__perlin_grad_basis + lVar14 + 4) * fVar24) - fVar33) * fVar28 + fVar33;
  fVar33 = fVar27 * ((((*(float *)(stb__perlin_grad_basis + lVar7 + 8) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar7) * fVar23 +
                       *(float *)(stb__perlin_grad_basis + lVar7 + 4) * fVar31) - fVar26) * fVar28 +
                     fVar26) - fVar33) + fVar33;
  return ((fVar27 * ((((*(float *)(stb__perlin_grad_basis + lVar4 + 8) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar4) * fVar30 +
                       *(float *)(stb__perlin_grad_basis + lVar4 + 4) * fVar31) - fVar25) * fVar28 +
                     fVar25) - fVar32) + fVar32) - fVar33) *
         ((fVar23 * 6.0 + -15.0) * fVar23 + 10.0) * fVar23 * fVar23 * fVar23 + fVar33;
}

Assistant:

float stb_perlin_noise3_internal(float x, float y, float z, int x_wrap, int y_wrap, int z_wrap, unsigned char seed)
{
   float u,v,w;
   float n000,n001,n010,n011,n100,n101,n110,n111;
   float n00,n01,n10,n11;
   float n0,n1;

   unsigned int x_mask = (x_wrap-1) & 255;
   unsigned int y_mask = (y_wrap-1) & 255;
   unsigned int z_mask = (z_wrap-1) & 255;
   int px = stb__perlin_fastfloor(x);
   int py = stb__perlin_fastfloor(y);
   int pz = stb__perlin_fastfloor(z);
   int x0 = px & x_mask, x1 = (px+1) & x_mask;
   int y0 = py & y_mask, y1 = (py+1) & y_mask;
   int z0 = pz & z_mask, z1 = (pz+1) & z_mask;
   int r0,r1, r00,r01,r10,r11;

   #define stb__perlin_ease(a)   (((a*6-15)*a + 10) * a * a * a)

   x -= px; u = stb__perlin_ease(x);
   y -= py; v = stb__perlin_ease(y);
   z -= pz; w = stb__perlin_ease(z);

   r0 = stb__perlin_randtab[x0+seed];
   r1 = stb__perlin_randtab[x1+seed];

   r00 = stb__perlin_randtab[r0+y0];
   r01 = stb__perlin_randtab[r0+y1];
   r10 = stb__perlin_randtab[r1+y0];
   r11 = stb__perlin_randtab[r1+y1];

   n000 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z0], x  , y  , z   );
   n001 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z1], x  , y  , z-1 );
   n010 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z0], x  , y-1, z   );
   n011 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z1], x  , y-1, z-1 );
   n100 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z0], x-1, y  , z   );
   n101 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z1], x-1, y  , z-1 );
   n110 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z0], x-1, y-1, z   );
   n111 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z1], x-1, y-1, z-1 );

   n00 = stb__perlin_lerp(n000,n001,w);
   n01 = stb__perlin_lerp(n010,n011,w);
   n10 = stb__perlin_lerp(n100,n101,w);
   n11 = stb__perlin_lerp(n110,n111,w);

   n0 = stb__perlin_lerp(n00,n01,v);
   n1 = stb__perlin_lerp(n10,n11,v);

   return stb__perlin_lerp(n0,n1,u);
}